

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

void __thiscall ctemplate::SectionTemplateNode::~SectionTemplateNode(SectionTemplateNode *this)

{
  NodeList *pNVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  pointer pMVar4;
  _List_node_base *p_Var5;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR__SectionTemplateNode_0014d188;
  pNVar1 = &this->node_list_;
  for (p_Var5 = (this->node_list_).
                super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var5 != (_List_node_base *)pNVar1;
      p_Var5 = p_Var5->_M_next) {
    if (p_Var5[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var5[1]._M_next)->_M_next + 8))();
    }
  }
  pcVar2 = (this->indentation_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->indentation_).field_2) {
    operator_delete(pcVar2);
  }
  p_Var5 = (pNVar1->
           super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)pNVar1) {
    p_Var3 = p_Var5->_M_next;
    operator_delete(p_Var5);
    p_Var5 = p_Var3;
  }
  pMVar4 = (this->token_).modvals.
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pMVar4 == (pointer)0x0) {
    return;
  }
  operator_delete(pMVar4);
  return;
}

Assistant:

SectionTemplateNode::~SectionTemplateNode() {
  VLOG(2) << "Deleting SectionTemplateNode: "
          << string(token_.text, token_.textlen) << " and its subnodes"
          << endl;

  // Need to delete the member of the list because the list is a list
  // of pointers to these instances.
  NodeList::iterator iter = node_list_.begin();
  for (; iter != node_list_.end(); ++iter) {
    delete (*iter);
  }
  VLOG(2) << "Finished deleting subnodes of SectionTemplateNode: "
          << string(token_.text, token_.textlen) << endl;
}